

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void issue431(void)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  
  r = roaring_bitmap_create_with_capacity(0);
  roaring_bitmap_add(r,100);
  roaring_bitmap_flip_inplace(r,0,0x65);
  r_00 = roaring_bitmap_create_with_capacity(0);
  roaring_bitmap_add_range_closed(r_00,0x32,100);
  roaring_bitmap_is_subset(r_00,r);
  roaring_bitmap_free(r_00);
  roaring_bitmap_free(r);
  return;
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}